

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

size_t __thiscall ON_WindowsBitmap::SizeofImage(ON_WindowsBitmap *this)

{
  size_t h;
  size_t w;
  size_t sizeImage;
  ON_WindowsBitmap *this_local;
  
  w = 0;
  if ((this->m_bmi != (ON_WindowsBITMAPINFO *)0x0) &&
     (w = (size_t)(this->m_bmi->bmiHeader).biSizeImage, w == 0)) {
    w = (long)((int)((this->m_bmi->bmiHeader).biWidth * (uint)(this->m_bmi->bmiHeader).biBitCount +
                     0x1f & 0xffffffe0) >> 3) * (long)(this->m_bmi->bmiHeader).biHeight;
  }
  return w;
}

Assistant:

size_t ON_WindowsBitmap::SizeofImage() const
{
  size_t sizeImage = 0;
  if ( nullptr != m_bmi ) 
  {
    sizeImage = m_bmi->bmiHeader.biSizeImage;
    if (0 == sizeImage)
    {
      const size_t w = ((((m_bmi->bmiHeader.biWidth * m_bmi->bmiHeader.biBitCount) + 31) & ~31) >> 3);
      const size_t h = m_bmi->bmiHeader.biHeight;
      sizeImage = w*h;
    }
  }
  return sizeImage;
}